

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O0

float __thiscall webrtc::NoiseSuppressionImpl::speech_probability(NoiseSuppressionImpl *this)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  NsState *handle;
  size_type sVar2;
  float fVar3;
  float local_68;
  unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
  *suppressor;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  *__range1;
  float probability_average;
  CritScope cs;
  NoiseSuppressionImpl *this_local;
  
  cs.cs_ = (CriticalSection *)this;
  rtc::CritScope::CritScope((CritScope *)&stack0xffffffffffffffe8,this->crit_);
  __range1._4_4_ = 0.0;
  __end1 = std::
           vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ::begin(&this->suppressors_);
  suppressor = (unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                *)std::
                  vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                  ::end(&this->suppressors_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_*,_std::vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>_>
                                     *)&suppressor), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_*,_std::vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>_>
              ::operator*(&__end1);
    this_01 = std::
              unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
              ::operator->(this_00);
    handle = Suppressor::state(this_01);
    fVar3 = WebRtcNs_prior_speech_probability(handle);
    __range1._4_4_ = fVar3 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_*,_std::vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::
          vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
          ::empty(&this->suppressors_);
  if (!bVar1) {
    sVar2 = std::
            vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
            ::size(&this->suppressors_);
    local_68 = (float)sVar2;
    __range1._4_4_ = __range1._4_4_ / local_68;
  }
  rtc::CritScope::~CritScope((CritScope *)&stack0xffffffffffffffe8);
  return __range1._4_4_;
}

Assistant:

float NoiseSuppressionImpl::speech_probability() const {
  rtc::CritScope cs(crit_);
#if defined(WEBRTC_NS_FLOAT)
  float probability_average = 0.0f;
  for (auto& suppressor : suppressors_) {
    probability_average +=
        WebRtcNs_prior_speech_probability(suppressor->state());
  }
  if (!suppressors_.empty()) {
    probability_average /= suppressors_.size();
  }
  return probability_average;
#elif defined(WEBRTC_NS_FIXED)
  // TODO(peah): Returning error code as a float! Remove this.
  // Currently not available for the fixed point implementation.
  return AudioProcessing::kUnsupportedFunctionError;
#endif
}